

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

uint GetFunctionRating(ExpressionContext *ctx,FunctionData *function,TypeFunction *instance,
                      ArrayView<CallArgumentData> arguments)

{
  ScopeData *type;
  ExprBase *pEVar1;
  uint uVar2;
  char cVar3;
  byte bVar4;
  CallArgumentData *pCVar5;
  ScopeData *pSVar6;
  uint uVar7;
  TypeArray *rArray;
  ScopeData *pSVar8;
  int iVar9;
  ScopeData *type_00;
  uint uVar10;
  ScopeData *pSVar11;
  TypeHandle *pTVar12;
  ulong uVar13;
  bool bVar14;
  FunctionValue functionValue;
  FunctionValue local_48;
  
  pCVar5 = arguments.data;
  if ((function->arguments).count == arguments.count) {
    pTVar12 = (instance->arguments).head;
    if (pTVar12 == (TypeHandle *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar13 = 0;
      uVar2 = 0;
      do {
        if ((function->arguments).count <= uVar13) {
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x199,
                        "T &SmallArray<ArgumentData, 4>::operator[](unsigned int) [T = ArgumentData, N = 4]"
                       );
        }
        if (uVar13 == arguments.count) {
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x22a,
                        "T &ArrayView<CallArgumentData>::operator[](unsigned int) [T = CallArgumentData]"
                       );
        }
        type_00 = (ScopeData *)pTVar12->type;
        type = (ScopeData *)pCVar5[uVar13].type;
        if (type_00 == type) {
          bVar4 = 0;
        }
        else if (type == (ScopeData *)ctx->typeNullPtr) {
          if ((type_00 == (ScopeData *)0x0) ||
             ((bVar4 = 0, *(uint *)&((TypeBase *)&type_00->uniqueId)->_vptr_TypeBase != 0x12 &&
              ((type_00 == (ScopeData *)0x0 ||
               ((*(uint *)&((TypeBase *)&type_00->uniqueId)->_vptr_TypeBase != 0x14 &&
                ((type_00 == (ScopeData *)0x0 ||
                 (*(uint *)&((TypeBase *)&type_00->uniqueId)->_vptr_TypeBase != 0x15)))))))))) {
            if ((type_00 != (ScopeData *)ctx->typeAutoRef) &&
               (type_00 != (ScopeData *)ctx->typeAutoArray)) goto LAB_001f5752;
LAB_001f5b1c:
            bVar4 = 0;
            uVar2 = uVar2 + 5;
          }
        }
        else {
LAB_001f5752:
          bVar4 = 0;
          if (*(bool *)&((TypeBase *)((long)&type_00->startOffset + 4))->_vptr_TypeBase == false) {
            if ((function->arguments).data[uVar13].isExplicit == true) {
              if ((type_00 == (ScopeData *)0x0) ||
                 (*(uint *)&((TypeBase *)&type_00->uniqueId)->_vptr_TypeBase != 0x15)) {
                type_00 = (ScopeData *)0x0;
              }
              if ((((type_00 == (ScopeData *)0x0) ||
                   (pEVar1 = pCVar5[uVar13].value, pEVar1 == (ExprBase *)0x0)) ||
                  (type == (ScopeData *)0x0)) ||
                 ((*(uint *)&((TypeBase *)&type->uniqueId)->_vptr_TypeBase != 0x15 &&
                  ((type == (ScopeData *)0x0 ||
                   (*(uint *)&((TypeBase *)&type->uniqueId)->_vptr_TypeBase != 0x1a)))))) {
LAB_001f59ef:
                bVar14 = false;
                cVar3 = '\0';
              }
              else {
                GetFunctionForType(&local_48,ctx,pEVar1->source,pEVar1,(TypeFunction *)type_00);
                bVar14 = local_48.function != (FunctionData *)0x0;
                if (local_48.function == (FunctionData *)0x0) goto LAB_001f59ef;
                cVar3 = bVar14 << 2;
              }
              bVar4 = cVar3 + !bVar14;
            }
            else if ((((type_00 == (ScopeData *)0x0) ||
                      (*(uint *)&((TypeBase *)&type_00->uniqueId)->_vptr_TypeBase != 0x14)) ||
                     (type == (ScopeData *)0x0)) ||
                    ((*(uint *)&((TypeBase *)&type->uniqueId)->_vptr_TypeBase != 0x13 ||
                     (uVar10 = uVar2 + 2,
                     *(ScopeData **)
                      &((TypeStruct *)((long)&type_00->functions + 0x18))->super_TypeBase !=
                     *(ScopeData **)((long)&type->types + 0x18))))) {
              if (((type_00 == (ScopeData *)ctx->typeAutoArray) && (type != (ScopeData *)0x0)) &&
                 ((*(uint *)&((TypeBase *)&type->uniqueId)->_vptr_TypeBase == 0x13 ||
                  ((type != (ScopeData *)0x0 &&
                   (*(uint *)&((TypeBase *)&type->uniqueId)->_vptr_TypeBase == 0x14))))))
              goto LAB_001f5b1c;
              if ((((type_00 != (ScopeData *)0x0) &&
                   (*(uint *)&((TypeBase *)&type_00->uniqueId)->_vptr_TypeBase == 0x12)) &&
                  (type != (ScopeData *)0x0)) &&
                 (*(uint *)&((TypeBase *)&type->uniqueId)->_vptr_TypeBase == 0x12)) {
                if ((type_00 == (ScopeData *)0x0) ||
                   (pSVar6 = type_00,
                   *(uint *)&((TypeBase *)&type_00->uniqueId)->_vptr_TypeBase != 0x12)) {
                  pSVar6 = (ScopeData *)0x0;
                }
                if ((type == (ScopeData *)0x0) ||
                   (pSVar8 = type, *(uint *)&((TypeBase *)&type->uniqueId)->_vptr_TypeBase != 0x12))
                {
                  pSVar8 = (ScopeData *)0x0;
                }
                pSVar6 = ((TypeStruct *)pSVar6)->typeScope;
                bVar4 = 0;
                if ((((pSVar6 != (ScopeData *)0x0) && (pSVar6->uniqueId == 0x14)) &&
                    (pSVar8 = *(ScopeData **)((long)&pSVar8->types + 0x18),
                    pSVar8 != (ScopeData *)0x0)) && (bVar4 = 0, pSVar8->uniqueId == 0x13)) {
                  bVar14 = (pSVar6->functions).little[1] ==
                           *(FunctionData **)((long)&pSVar8->types + 0x18);
                  uVar10 = uVar2 + 10;
                  if (!bVar14) {
                    uVar10 = uVar2;
                  }
                  uVar2 = uVar10;
                  bVar4 = bVar14 << 2;
                }
                if (bVar4 != 0) goto LAB_001f5bc9;
              }
              uVar7 = uVar2;
              if (((type_00 != (ScopeData *)0x0) &&
                  (*(uint *)&((TypeBase *)&type_00->uniqueId)->_vptr_TypeBase == 0x12)) &&
                 ((type != (ScopeData *)0x0 &&
                  (*(uint *)&((TypeBase *)&type->uniqueId)->_vptr_TypeBase == 0x12)))) {
                if ((type_00 == (ScopeData *)0x0) ||
                   (pSVar6 = type_00,
                   *(uint *)&((TypeBase *)&type_00->uniqueId)->_vptr_TypeBase != 0x12)) {
                  pSVar6 = (ScopeData *)0x0;
                }
                if ((type == (ScopeData *)0x0) ||
                   (pSVar8 = type, *(uint *)&((TypeBase *)&type->uniqueId)->_vptr_TypeBase != 0x12))
                {
                  pSVar8 = (ScopeData *)0x0;
                }
                pSVar6 = ((TypeStruct *)pSVar6)->typeScope;
                bVar4 = 0;
                if ((((pSVar6 != (ScopeData *)0x0) && (pSVar6->uniqueId == 0x18)) &&
                    (pSVar8 = *(ScopeData **)((long)&pSVar8->types + 0x18),
                    pSVar8 != (ScopeData *)0x0)) && (bVar4 = 0, pSVar8->uniqueId == 0x18)) {
                  if ((pSVar6 == (ScopeData *)0x0) || (pSVar6->uniqueId != 0x18)) {
                    pSVar6 = (ScopeData *)0x0;
                  }
                  if ((pSVar8 == (ScopeData *)0x0) || (pSVar8->uniqueId != 0x18)) {
                    pSVar8 = (ScopeData *)0x0;
                  }
                  if (pSVar8 != (ScopeData *)0x0) {
                    iVar9 = 0;
                    pSVar11 = pSVar8;
                    do {
                      if (pSVar11 == pSVar6) goto LAB_001f59d9;
                      iVar9 = iVar9 + 1;
                      pSVar11 = (ScopeData *)(pSVar11->scopes).allocator;
                    } while (pSVar11 != (ScopeData *)0x0);
                    iVar9 = -1;
LAB_001f59d9:
                    if (iVar9 != -1) {
                      uVar2 = uVar2 + 5;
                      bVar4 = 4;
                      goto LAB_001f5c16;
                    }
                  }
                  if (pSVar6 != (ScopeData *)0x0) {
                    iVar9 = 0;
                    do {
                      if (pSVar6 == pSVar8) goto LAB_001f5c03;
                      iVar9 = iVar9 + 1;
                      pSVar6 = (ScopeData *)(pSVar6->scopes).allocator;
                    } while (pSVar6 != (ScopeData *)0x0);
                    iVar9 = -1;
LAB_001f5c03:
                    uVar10 = uVar2 + 10;
                    if (iVar9 == -1) {
                      uVar10 = uVar2;
                    }
                    uVar2 = uVar10;
                    bVar4 = (iVar9 != -1) << 2;
                  }
                }
LAB_001f5c16:
                uVar7 = uVar2;
                if (bVar4 != 0) goto LAB_001f5bc9;
              }
              if ((((type_00 != (ScopeData *)0x0) &&
                   (*(uint *)&((TypeBase *)&type_00->uniqueId)->_vptr_TypeBase == 0x18)) &&
                  (type != (ScopeData *)0x0)) &&
                 (*(uint *)&((TypeBase *)&type->uniqueId)->_vptr_TypeBase == 0x18)) {
                if ((type_00 == (ScopeData *)0x0) ||
                   (pSVar6 = type_00,
                   *(uint *)&((TypeBase *)&type_00->uniqueId)->_vptr_TypeBase != 0x18)) {
                  pSVar6 = (ScopeData *)0x0;
                }
                if ((type == (ScopeData *)0x0) ||
                   (pSVar8 = type, *(uint *)&((TypeBase *)&type->uniqueId)->_vptr_TypeBase != 0x18))
                {
                  pSVar8 = (ScopeData *)0x0;
                }
                iVar9 = 0;
                bVar14 = false;
                if (pSVar8 != (ScopeData *)0x0) {
                  do {
                    if (pSVar8 == pSVar6) goto LAB_001f5a55;
                    iVar9 = iVar9 + 1;
                    pSVar8 = *(ScopeData **)
                              &(((TypeStruct *)((long)&pSVar8->scopes + 0x18))->super_TypeBase).
                               typeID;
                  } while (pSVar8 != (ScopeData *)0x0);
                  iVar9 = -1;
LAB_001f5a55:
                  bVar14 = iVar9 != -1;
                }
                uVar10 = uVar7 + 5;
                if (bVar14) goto LAB_001f5af2;
              }
              if (type_00 == (ScopeData *)0x0) {
LAB_001f5b4d:
                if (type_00 == (ScopeData *)ctx->typeAutoRef) {
                  if ((type == (ScopeData *)0x0) ||
                     (*(uint *)&((TypeBase *)&type->uniqueId)->_vptr_TypeBase != 0x12)) {
                    if (type_00 != (ScopeData *)ctx->typeAutoRef) goto LAB_001f5b75;
                    uVar2 = uVar7 + 10;
                  }
                  else {
                    uVar2 = uVar7 + 5;
                  }
                  bVar4 = 0;
                }
                else {
LAB_001f5b75:
                  bVar14 = ExpressionContext::IsNumericType(ctx,(TypeBase *)type_00);
                  bVar4 = 1;
                  uVar2 = uVar7;
                  if (bVar14) {
                    bVar14 = ExpressionContext::IsNumericType(ctx,(TypeBase *)type);
                    bVar4 = bVar14 * '\x03' + 1;
                    uVar2 = uVar7 + bVar14;
                  }
                }
              }
              else if (*(uint *)&((TypeBase *)&type_00->uniqueId)->_vptr_TypeBase == 0x15) {
                if ((type_00 == (ScopeData *)0x0) ||
                   (*(uint *)&((TypeBase *)&type_00->uniqueId)->_vptr_TypeBase != 0x15)) {
                  type_00 = (ScopeData *)0x0;
                }
                pEVar1 = pCVar5[uVar13].value;
                if ((((pEVar1 != (ExprBase *)0x0) && (type != (ScopeData *)0x0)) &&
                    ((*(uint *)&((TypeBase *)&type->uniqueId)->_vptr_TypeBase == 0x15 ||
                     ((type != (ScopeData *)0x0 &&
                      (*(uint *)&((TypeBase *)&type->uniqueId)->_vptr_TypeBase == 0x1a)))))) &&
                   (GetFunctionForType(&local_48,ctx,pEVar1->source,pEVar1,(TypeFunction *)type_00),
                   uVar10 = uVar7, local_48.function != (FunctionData *)0x0)) goto LAB_001f5af2;
                bVar4 = 1;
                uVar2 = uVar7;
              }
              else {
                if (((type_00 == (ScopeData *)0x0) ||
                    (*(uint *)&((TypeBase *)&type_00->uniqueId)->_vptr_TypeBase != 0x12)) ||
                   (uVar2 = uVar7 + 5, *(ScopeData **)((long)&type_00->types + 0x18) != type))
                goto LAB_001f5b4d;
                bVar4 = 0;
              }
            }
            else {
LAB_001f5af2:
              bVar4 = 0;
              uVar2 = uVar10;
            }
          }
        }
LAB_001f5bc9:
        if ((bVar4 & 0xfb) != 0) goto LAB_001f5c21;
        uVar13 = uVar13 + 1;
        pTVar12 = pTVar12->next;
      } while (pTVar12 != (TypeHandle *)0x0);
    }
  }
  else {
LAB_001f5c21:
    uVar2 = 0xffffffff;
  }
  return uVar2;
}

Assistant:

unsigned GetFunctionRating(ExpressionContext &ctx, FunctionData *function, TypeFunction *instance, ArrayView<CallArgumentData> arguments)
{
	if(function->arguments.size() != arguments.size())
		return ~0u;	// Definitely, this isn't the function we are trying to call. Argument count does not match.

	unsigned rating = 0;

	unsigned i = 0;

	for(TypeHandle *argType = instance->arguments.head; argType; argType = argType->next, i++)
	{
		ArgumentData &expectedArgument = function->arguments[i];
		TypeBase *expectedType = argType->type;

		CallArgumentData &actualArgument = arguments[i];
		TypeBase *actualType = actualArgument.type;

		if(expectedType != actualType)
		{
			if(actualType == ctx.typeNullPtr)
			{
				// nullptr is convertable to T ref, T[] and function pointers
				if(isType<TypeRef>(expectedType) || isType<TypeUnsizedArray>(expectedType) || isType<TypeFunction>(expectedType))
					continue;

				// nullptr is also convertable to auto ref and auto[], but it has the same rating as type ref -> auto ref and array -> auto[] defined below
				if(expectedType == ctx.typeAutoRef || expectedType == ctx.typeAutoArray)
				{
					rating += 5;
					continue;
				}
			}

			// Generic function argument
			if(expectedType->isGeneric)
				continue;

			if(expectedArgument.isExplicit)
			{
				if(TypeFunction *target = getType<TypeFunction>(expectedType))
				{
					if(actualArgument.value && (isType<TypeFunction>(actualArgument.type) || isType<TypeFunctionSet>(actualArgument.type)))
					{
						if(FunctionValue functionValue = GetFunctionForType(ctx, actualArgument.value->source, actualArgument.value, target))
							continue;
					}
				}

				return ~0u;
			}

			// array -> class (unsized array)
			if(isType<TypeUnsizedArray>(expectedType) && isType<TypeArray>(actualType))
			{
				TypeUnsizedArray *lArray = getType<TypeUnsizedArray>(expectedType);
				TypeArray *rArray = getType<TypeArray>(actualType);

				if(lArray->subType == rArray->subType)
				{
					rating += 2;
					continue;
				}
			}

			// array -> auto[]
			if(expectedType == ctx.typeAutoArray && (isType<TypeArray>(actualType) || isType<TypeUnsizedArray>(actualType)))
			{
				rating += 5;
				continue;
			}

			// array[N] ref -> array[] -> array[] ref
			if(isType<TypeRef>(expectedType) && isType<TypeRef>(actualType))
			{
				TypeRef *lRef = getType<TypeRef>(expectedType);
				TypeRef *rRef = getType<TypeRef>(actualType);

				if(isType<TypeUnsizedArray>(lRef->subType) && isType<TypeArray>(rRef->subType))
				{
					TypeUnsizedArray *lArray = getType<TypeUnsizedArray>(lRef->subType);
					TypeArray *rArray = getType<TypeArray>(rRef->subType);

					if(lArray->subType == rArray->subType)
					{
						rating += 10;
						continue;
					}
				}
			}

			// derived ref -> base ref
			// base ref -> derived ref
			if(isType<TypeRef>(expectedType) && isType<TypeRef>(actualType))
			{
				TypeRef *lRef = getType<TypeRef>(expectedType);
				TypeRef *rRef = getType<TypeRef>(actualType);

				if(isType<TypeClass>(lRef->subType) && isType<TypeClass>(rRef->subType))
				{
					TypeClass *lClass = getType<TypeClass>(lRef->subType);
					TypeClass *rClass = getType<TypeClass>(rRef->subType);

					if(IsDerivedFrom(rClass, lClass))
					{
						rating += 5;
						continue;
					}

					if(IsDerivedFrom(lClass, rClass))
					{
						rating += 10;
						continue;
					}
				}
			}

			if(isType<TypeClass>(expectedType) && isType<TypeClass>(actualType))
			{
				TypeClass *lClass = getType<TypeClass>(expectedType);
				TypeClass *rClass = getType<TypeClass>(actualType);

				if(IsDerivedFrom(rClass, lClass))
				{
					rating += 5;
					continue;
				}
			}

			if(isType<TypeFunction>(expectedType))
			{
				TypeFunction *lFunction = getType<TypeFunction>(expectedType);

				if(actualArgument.value && (isType<TypeFunction>(actualArgument.type) || isType<TypeFunctionSet>(actualArgument.type)))
				{
					if(FunctionValue functionValue = GetFunctionForType(ctx, actualArgument.value->source, actualArgument.value, lFunction))
						continue;
				}
				
				return ~0u;
			}

			// type -> type ref
			if(isType<TypeRef>(expectedType))
			{
				TypeRef *lRef = getType<TypeRef>(expectedType);

				if(lRef->subType == actualType)
				{
					rating += 5;
					continue;
				}
			}

			// type ref -> auto ref
			if(expectedType == ctx.typeAutoRef && isType<TypeRef>(actualType))
			{
				rating += 5;
				continue;
			}

			// type -> type ref -> auto ref
			if(expectedType == ctx.typeAutoRef)
			{
				rating += 10;
				continue;
			}

			// numeric -> numeric
			if(ctx.IsNumericType(expectedType) && ctx.IsNumericType(actualType))
			{
				rating += 1;
				continue;
			}

			return ~0u;
		}
	}

	return rating;
}